

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.c
# Opt level: O1

void disassembler_initialize(void)

{
  if (!disassembler_initialized) {
    disassembler_initialized = true;
  }
  return;
}

Assistant:

void disassembler_initialize() {
    if (disassembler_initialized) {
        return;
    }

#ifdef HAVE_CAPSTONE
    if (cs_open(CS_ARCH_ARM, CS_MODE_THUMB | CS_MODE_LITTLE_ENDIAN, &handle_thumb) != CS_ERR_OK) {
        logfatal("Failed to initialize capstone for ARM THUMB")
    }

    if (cs_open(CS_ARCH_ARM, CS_MODE_LITTLE_ENDIAN, &handle_arm) != CS_ERR_OK) {
        logfatal("Failed to initialize capstone for ARM")
    }
#endif

    disassembler_initialized = true;
}